

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh.h
# Opt level: O2

bool __thiscall bvh_node::hit(bvh_node *this,ray *r,interval ray_t,hit_record *rec)

{
  element_type *peVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  byte bVar5;
  double dVar6;
  
  dVar6 = ray_t.max;
  bVar2 = aabb::hit(&this->bbox,r,ray_t);
  if (bVar2) {
    peVar1 = (this->left).super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    iVar3 = (*peVar1->_vptr_hittable[2])(ray_t.min,dVar6,peVar1,r,rec);
    peVar1 = (this->right).super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if ((byte)iVar3 != 0) {
      dVar6 = rec->t;
    }
    iVar4 = (*peVar1->_vptr_hittable[2])(ray_t.min,dVar6,peVar1,r,rec);
    bVar5 = (byte)iVar3 | (byte)iVar4;
  }
  else {
    bVar5 = 0;
  }
  return (bool)bVar5;
}

Assistant:

bool hit(const ray& r, interval ray_t, hit_record& rec) const override {
        if (!bbox.hit(r, ray_t))
            return false;

        bool hit_left = left->hit(r, ray_t, rec);
        bool hit_right = right->hit(r, interval(ray_t.min, hit_left ? rec.t : ray_t.max), rec);

        return hit_left || hit_right;
    }